

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrFoveationConfigurationHTC *value)

{
  bool bVar1;
  undefined7 in_register_00000009;
  XrResult XVar2;
  uint32_t in_stack_fffffffffffffdfc;
  string local_200;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  string local_1c8;
  ostringstream oss_enum;
  
  XVar2 = XR_SUCCESS;
  if ((int)CONCAT71(in_register_00000009,check_members) != 0) {
    std::__cxx11::string::string
              ((string *)&oss_enum,"XrFoveationConfigurationHTC",(allocator *)&local_1c8);
    std::__cxx11::string::string((string *)&local_200,"level",(allocator *)&stack0xfffffffffffffdff)
    ;
    bVar1 = ValidateXrEnum(instance_info,command_name,(string *)&oss_enum,&local_200,objects_info,
                           value->level);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&oss_enum);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_enum);
      std::operator<<((ostream *)&oss_enum,
                      "XrFoveationConfigurationHTC contains invalid XrFoveationLevelHTC \"level\" enum value "
                     );
      Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffdfc);
      std::operator<<((ostream *)&oss_enum,(string *)&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::string
                ((string *)&local_200,"VUID-XrFoveationConfigurationHTC-level-parameter",
                 (allocator *)&stack0xfffffffffffffdff);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1e0,objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&local_200,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1e0,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_enum);
      XVar2 = XR_ERROR_VALIDATION_FAILURE;
    }
  }
  return XVar2;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrFoveationConfigurationHTC* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrFoveationLevelHTC value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrFoveationConfigurationHTC", "level", objects_info, value->level)) {
        std::ostringstream oss_enum;
        oss_enum << "XrFoveationConfigurationHTC contains invalid XrFoveationLevelHTC \"level\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->level));
        CoreValidLogMessage(instance_info, "VUID-XrFoveationConfigurationHTC-level-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}